

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

bool __thiscall t_cpp_generator::is_complex_type(t_cpp_generator *this,t_type *ttype)

{
  int iVar1;
  t_type *ptVar2;
  bool bVar3;
  
  ptVar2 = t_type::get_true_type(ttype);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
  bVar3 = true;
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
        if ((char)iVar1 == '\0') {
          bVar3 = false;
        }
        else {
          bVar3 = *(int *)&ptVar2[1].super_t_doc._vptr_t_doc == 1;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool is_complex_type(t_type* ttype) {
    ttype = get_true_type(ttype);

    return ttype->is_container() || ttype->is_struct() || ttype->is_xception()
           || (ttype->is_base_type()
               && (((t_base_type*)ttype)->get_base() == t_base_type::TYPE_STRING));
  }